

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_helper.cpp
# Opt level: O0

void ftxui::box_helper::anon_unknown_2::ComputeShrinkHard
               (vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                *elements,int extra_space,int size)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int local_40;
  int local_3c;
  reference pEStack_38;
  int added_space;
  Element *element;
  iterator __end2;
  iterator __begin2;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *__range2;
  int size_local;
  int extra_space_local;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *elements_local;
  
  __range2._0_4_ = size;
  __range2._4_4_ = extra_space;
  _size_local = elements;
  __end2 = std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
           begin(elements);
  element = (Element *)
            std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
            end(elements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ftxui::box_helper::Element_*,_std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>_>
                                *)&element);
    if (!bVar1) break;
    pEStack_38 = __gnu_cxx::
                 __normal_iterator<ftxui::box_helper::Element_*,_std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>_>
                 ::operator*(&__end2);
    if (pEStack_38->flex_shrink == 0) {
      iVar2 = __range2._4_4_ * pEStack_38->min_size;
      local_40 = 1;
      piVar3 = std::max<int>(&local_40,(int *)&__range2);
      local_3c = iVar2 / *piVar3;
      __range2._4_4_ = __range2._4_4_ - local_3c;
      __range2._0_4_ = (int)__range2 - pEStack_38->min_size;
      pEStack_38->size = pEStack_38->min_size + local_3c;
    }
    else {
      pEStack_38->size = 0;
    }
    __gnu_cxx::
    __normal_iterator<ftxui::box_helper::Element_*,_std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ComputeShrinkHard(std::vector<Element>* elements,
                       int extra_space,
                       int size) {
  for (Element& element : *elements) {
    if (element.flex_shrink) {
      element.size = 0;
      continue;
    }

    int added_space = extra_space * element.min_size / std::max(1, size);
    extra_space -= added_space;
    size -= element.min_size;

    element.size = element.min_size + added_space;
  }
}